

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

char * llvm::itaniumDemangle(char *MangledName,char *Buf,size_t *N,int *Status)

{
  bool bVar1;
  size_t sVar2;
  Node *this;
  int iVar3;
  OutputStream S;
  Db Parser;
  
  if ((MangledName == (char *)0x0) || (N == (size_t *)0x0 && Buf != (char *)0x0)) {
    if (Status != (int *)0x0) {
      *Status = -3;
    }
    return (char *)0x0;
  }
  sVar2 = strlen(MangledName);
  Parser.Last = MangledName + sVar2;
  Parser.Names.First = Parser.Names.Inline;
  Parser.Names.Cap = (Node **)&Parser.Subs;
  Parser.Subs.First = Parser.Subs.Inline;
  Parser.Subs.Cap = (Node **)&Parser.TemplateParams;
  Parser.TemplateParams.First = Parser.TemplateParams.Inline;
  Parser.TemplateParams.Cap = (Node **)&Parser.ForwardTemplateRefs;
  Parser.ForwardTemplateRefs.First = Parser.ForwardTemplateRefs.Inline;
  Parser.ForwardTemplateRefs.Cap = (ForwardTemplateReference **)&Parser.TypeCallback;
  Parser.TypeCallback = (_func_void_void_ptr_char_ptr *)0x0;
  Parser.TypeCallbackContext = (void *)0x0;
  Parser.TryToParseTemplateArgs = true;
  Parser.PermitForwardTemplateReferences = false;
  Parser.ParsingLambdaParams = false;
  Parser.ASTAllocator.BlockList = (BlockMeta *)&Parser.ASTAllocator;
  Parser.ASTAllocator.InitialBuffer[0] = '\0';
  Parser.ASTAllocator.InitialBuffer[1] = '\0';
  Parser.ASTAllocator.InitialBuffer[2] = '\0';
  Parser.ASTAllocator.InitialBuffer[3] = '\0';
  Parser.ASTAllocator.InitialBuffer[4] = '\0';
  Parser.ASTAllocator.InitialBuffer[5] = '\0';
  Parser.ASTAllocator.InitialBuffer[6] = '\0';
  Parser.ASTAllocator.InitialBuffer[7] = '\0';
  Parser.ASTAllocator.InitialBuffer[8] = '\0';
  Parser.ASTAllocator.InitialBuffer[9] = '\0';
  Parser.ASTAllocator.InitialBuffer[10] = '\0';
  Parser.ASTAllocator.InitialBuffer[0xb] = '\0';
  Parser.ASTAllocator.InitialBuffer[0xc] = '\0';
  Parser.ASTAllocator.InitialBuffer[0xd] = '\0';
  Parser.ASTAllocator.InitialBuffer[0xe] = '\0';
  Parser.ASTAllocator.InitialBuffer[0xf] = '\0';
  S.CurrentPackIndex = 0xffffffff;
  S.CurrentPackMax = 0xffffffff;
  Parser.First = MangledName;
  Parser.Names.Last = Parser.Names.First;
  Parser.Subs.Last = Parser.Subs.First;
  Parser.TemplateParams.Last = Parser.TemplateParams.First;
  Parser.ForwardTemplateRefs.Last = Parser.ForwardTemplateRefs.First;
  this = anon_unknown.dwarf_18d51b::Db::parse(&Parser);
  if (this == (Node *)0x0) {
    iVar3 = -2;
  }
  else {
    bVar1 = anon_unknown.dwarf_18d51b::initializeOutputStream(Buf,N,&S,0x400);
    if (!bVar1) {
      if (Parser.ForwardTemplateRefs.First != Parser.ForwardTemplateRefs.Last) {
        __assert_fail("Parser.ForwardTemplateRefs.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Demangle/ItaniumDemangle.cpp"
                      ,0x1375,"char *llvm::itaniumDemangle(const char *, char *, size_t *, int *)");
      }
      anon_unknown.dwarf_18d51b::Node::print(this,&S);
      iVar3 = 0;
      OutputStream::operator+=(&S,'\0');
      if (N != (size_t *)0x0) {
        *N = S.CurrentPosition;
      }
      goto LAB_00147d2b;
    }
    iVar3 = -1;
  }
  S.Buffer = (char *)0x0;
LAB_00147d2b:
  if (Status != (int *)0x0) {
    *Status = iVar3;
  }
  anon_unknown.dwarf_18d51b::Db::~Db(&Parser);
  return S.Buffer;
}

Assistant:

char *llvm::itaniumDemangle(const char *MangledName, char *Buf,
                            size_t *N, int *Status) {
  if (MangledName == nullptr || (Buf != nullptr && N == nullptr)) {
    if (Status)
      *Status = demangle_invalid_args;
    return nullptr;
  }

  int InternalStatus = demangle_success;
  Db Parser(MangledName, MangledName + std::strlen(MangledName));
  OutputStream S;

  Node *AST = Parser.parse();

  if (AST == nullptr)
    InternalStatus = demangle_invalid_mangled_name;
  else if (initializeOutputStream(Buf, N, S, 1024))
    InternalStatus = demangle_memory_alloc_failure;
  else {
    assert(Parser.ForwardTemplateRefs.empty());
    AST->print(S);
    S += '\0';
    if (N != nullptr)
      *N = S.getCurrentPosition();
    Buf = S.getBuffer();
  }

  if (Status)
    *Status = InternalStatus;
  return InternalStatus == demangle_success ? Buf : nullptr;
}